

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Combine<duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *source,
          ArgMinMaxState<duckdb::timestamp_t,_duckdb::string_t> *target,AggregateInputData *param_3)

{
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar1;
  bool bVar2;
  string_t new_value;
  
  if ((*this == (ArgMinMaxBase<duckdb::GreaterThan,false>)0x1) &&
     (((source->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar2 = string_t::StringComparisonOperators::GreaterThan
                         ((string_t *)(this + 0x10),&source->value), bVar2)))) {
    AVar1 = this[1];
    (source->super_ArgMinMaxStateBase).arg_null = (bool)AVar1;
    if (AVar1 == (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0) {
      (source->arg).value = *(int64_t *)(this + 8);
    }
    new_value.value.pointer.ptr = (char *)param_3;
    new_value.value._0_8_ = *(undefined8 *)(this + 0x18);
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&source->value,*(string_t **)(this + 0x10),new_value);
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}